

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file_handle.cpp
# Opt level: O0

void __thiscall
SplitFixture_Empty_Test<const_unsigned_char>::~SplitFixture_Empty_Test
          (SplitFixture_Empty_Test<const_unsigned_char> *this)

{
  SplitFixture_Empty_Test<const_unsigned_char> *this_local;
  
  ~SplitFixture_Empty_Test(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TYPED_TEST (SplitFixture, Empty) {
    TypeParam buffer{};
    constexpr std::size_t size{0};
    EXPECT_CALL (this->callback, call (&buffer, size)).Times (0);

    using pstore::file::details::split;
    std::size_t const total = split<std::uint16_t> (&buffer, size, this->callback);
    EXPECT_EQ (size, total);
}